

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  state *psVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  element_type *peVar5;
  shared_ptr<asio::io_context> local_608;
  undefined1 local_5f8 [8];
  shared_ptr<asio::io_context> aioc;
  anon_class_16_2_20c22cdc local_5e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_5d0;
  _Base_ptr local_590;
  anon_class_8_1_ba1d3927 local_588;
  long local_580;
  pair<const_discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_578;
  anon_class_16_2_20c22cdc local_550;
  function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  local_540;
  allocator<char> local_519;
  string local_518 [32];
  anon_class_8_1_ba1d3927 local_4f8;
  function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  local_4f0;
  allocator<char> local_4c9;
  string local_4c8 [32];
  anon_class_8_1_ba1d3927 local_4a8;
  function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  local_4a0;
  allocator<char> local_479;
  string local_478 [32];
  anon_class_8_1_ba1d3927 local_458;
  function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  local_450;
  allocator<char> local_429;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [39];
  allocator<char> local_3d9;
  string local_3d8 [32];
  _Base_ptr local_3b8;
  anon_class_8_1_89917c4a local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_3a8;
  omittable_field<int> local_360;
  omittable_field<int> local_340;
  omittable_field<int> local_320;
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  omittable_field<bool> local_2e0;
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  nullable_omittable_field<int> local_2a0;
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  omittable_field<bool> local_260;
  omittable_field<bool> local_240;
  omittable_field<bool> local_220;
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1e0;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1c8;
  field<discordpp::Snowflake> local_1b0;
  undefined1 local_1a0 [8];
  User self;
  shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
  bot;
  string local_30 [8];
  string token;
  
  token.field_2._12_4_ = 0;
  discordpp::log::filter = 2;
  discordpp::log::out = (undefined *)&std::cerr;
  poVar3 = std::operator<<((ostream *)&std::cout,"Howdy, and thanks for trying out Discord++!\n");
  poVar3 = std::operator<<(poVar3,
                           "Feel free to drop into the official server at https://discord.gg/4stCdkDHw6 if you have any questions.\n\n"
                          );
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Starting bot...\n\n");
  getToken_abi_cxx11_();
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::
    make_shared<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>>
              ();
    psVar1 = &self.public_flags.super_field<int>.s_;
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)psVar1);
    (&(peVar5->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0x8)
    [*(long *)(*(long *)&(peVar5->
                         super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                         ).
                         super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
              + -0x18)] = 1;
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)psVar1);
    *(undefined2 *)
     &(peVar5->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0x6a = 0x200;
    discordpp::field<discordpp::Snowflake>::field(&local_1b0);
    discordpp::
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              (&local_1c8);
    discordpp::
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              (&local_1e0);
    discordpp::
    nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::nullable_field(&local_200);
    discordpp::omittable_field<bool>::omittable_field(&local_220);
    discordpp::omittable_field<bool>::omittable_field(&local_240);
    discordpp::omittable_field<bool>::omittable_field(&local_260);
    discordpp::
    nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::nullable_omittable_field(&local_280);
    discordpp::nullable_omittable_field<int>::nullable_omittable_field(&local_2a0);
    discordpp::
    omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::omittable_field(&local_2c0);
    discordpp::omittable_field<bool>::omittable_field(&local_2e0);
    discordpp::
    nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::nullable_omittable_field(&local_300);
    discordpp::omittable_field<int>::omittable_field(&local_320);
    discordpp::omittable_field<int>::omittable_field(&local_340);
    discordpp::omittable_field<int>::omittable_field(&local_360);
    discordpp::User::User
              ((User *)local_1a0,&local_1b0,&local_1c8,&local_1e0,&local_200,&local_220,&local_240,
               &local_260,&local_280,&local_2a0,&local_2c0,&local_2e0,&local_300,&local_320,
               &local_340,&local_360);
    discordpp::omittable_field<int>::~omittable_field(&local_360);
    discordpp::omittable_field<int>::~omittable_field(&local_340);
    discordpp::omittable_field<int>::~omittable_field(&local_320);
    discordpp::
    nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~nullable_omittable_field(&local_300);
    discordpp::omittable_field<bool>::~omittable_field(&local_2e0);
    discordpp::
    omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~omittable_field(&local_2c0);
    discordpp::nullable_omittable_field<int>::~nullable_omittable_field(&local_2a0);
    discordpp::
    nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~nullable_omittable_field(&local_280);
    discordpp::omittable_field<bool>::~omittable_field(&local_260);
    discordpp::omittable_field<bool>::~omittable_field(&local_240);
    discordpp::omittable_field<bool>::~omittable_field(&local_220);
    discordpp::
    nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~nullable_field(&local_200);
    discordpp::
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
              (&local_1e0);
    discordpp::
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~field
              (&local_1c8);
    discordpp::field<discordpp::Snowflake>::~field(&local_1b0);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    lVar2 = *(long *)(*(long *)&(peVar5->
                                super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                                ).
                                super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                     + -0x18);
    local_3b0.self = (User *)local_1a0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
    ::
    pair<const_char_(&)[6],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiscordPP[P]echo_bot_main_cc:57:19),_true>
              (&local_3a8,(char (*) [6])"READY",&local_3b0);
    local_3b8 = (_Base_ptr)
                std::
                multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                ::insert((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                          *)(&(peVar5->
                              super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                              ).
                              super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                              .field_0x10 + lVar2),&local_3a8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
    ::~pair(&local_3a8);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::__cxx11::string::operator=
              ((string *)
               &(peVar5->
                super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                ).
                super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                .prefix,"~");
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3d8,"help",&local_3d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_400,"Mention me and I\'ll echo your message back!",&local_401);
    (**(code **)(*(long *)&(peVar5->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x88))(peVar5,local_3d8,local_400);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator(&local_401);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_428,"about",&local_429);
    local_458.bot =
         (shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
          *)&self.public_flags.super_field<int>.s_;
    std::
    function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
    ::function<main::__1,void>
              ((function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
                *)&local_450,&local_458);
    (**(code **)(*(long *)&(peVar5->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar5,local_428,&local_450);
    std::
    function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
    ::~function(&local_450);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator(&local_429);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_478,"lookatthis",&local_479);
    local_4a8.bot =
         (shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
          *)&self.public_flags.super_field<int>.s_;
    std::
    function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
    ::function<main::__2,void>
              ((function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
                *)&local_4a0,&local_4a8);
    (**(code **)(*(long *)&(peVar5->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar5,local_478,&local_4a0);
    std::
    function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
    ::~function(&local_4a0);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator(&local_479);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4c8,"channelinfo",&local_4c9);
    local_4f8.bot =
         (shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
          *)&self.public_flags.super_field<int>.s_;
    std::
    function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
    ::function<main::__3,void>
              ((function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
                *)&local_4f0,&local_4f8);
    (**(code **)(*(long *)&(peVar5->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar5,local_4c8,&local_4f0);
    std::
    function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
    ::~function(&local_4f0);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_518,"registerslash",&local_519);
    local_550.bot =
         (shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
          *)&self.public_flags.super_field<int>.s_;
    local_550.self = (User *)local_1a0;
    std::
    function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
    ::function<main::__4,void>
              ((function<void(nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>
                *)&local_540,&local_550);
    (**(code **)(*(long *)&(peVar5->
                           super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                           ).
                           super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                + 0x80))(peVar5,local_518,&local_540);
    std::
    function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
    ::~function(&local_540);
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator(&local_519);
    psVar1 = &self.public_flags.super_field<int>.s_;
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)psVar1);
    local_580 = 0xc3c56176dc27028;
    local_588.bot =
         (shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
          *)psVar1;
    std::
    pair<const_discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
    ::
    pair<long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiscordPP[P]echo_bot_main_cc:131:30),_true>
              (&local_578,&local_580,&local_588);
    local_590 = (_Base_ptr)
                std::
                multimap<discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                ::insert((multimap<discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                          *)&(peVar5->
                             super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                             ).
                             super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                             .field_0xc8,&local_578);
    std::
    pair<const_discordpp::Snowflake,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
    ::~pair(&local_578);
    psVar1 = &self.public_flags.super_field<int>.s_;
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)psVar1);
    lVar2 = *(long *)(*(long *)&(peVar5->
                                super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                                ).
                                super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                     + -0x18);
    local_5e0.self = (User *)local_1a0;
    local_5e0.bot =
         (shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
          *)psVar1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
    ::
    pair<const_char_(&)[15],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiscordPP[P]echo_bot_main_cc:147:28),_true>
              (&local_5d0,(char (*) [15])"MESSAGE_CREATE",&local_5e0);
    aioc.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
         ::insert((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                   *)(&(peVar5->
                       super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                       ).
                       super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                       .field_0x10 + lVar2),&local_5d0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
    ::~pair(&local_5d0);
    std::make_shared<asio::io_context>();
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    std::shared_ptr<asio::io_context>::shared_ptr
              (&local_608,(shared_ptr<asio::io_context> *)local_5f8);
    (*(code *)**(undefined8 **)
                &(peVar5->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
    )(peVar5,9,local_30,&local_608);
    std::shared_ptr<asio::io_context>::~shared_ptr(&local_608);
    peVar5 = std::
             __shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&self.public_flags.super_field<int>.s_);
    discordpp::BotStruct::run
              ((BotStruct *)
               (&(peVar5->
                 super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                 ).
                 super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                 .field_0x0 +
               *(long *)(*(long *)&(peVar5->
                                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                                   ).
                                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                        + -0x18)));
    token.field_2._12_4_ = 0;
    std::shared_ptr<asio::io_context>::~shared_ptr((shared_ptr<asio::io_context> *)local_5f8);
    discordpp::User::~User((User *)local_1a0);
    std::
    shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
    ::~shared_ptr((shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>_>
                   *)&self.public_flags.super_field<int>.s_);
    std::__cxx11::string::~string(local_30);
    return token.field_2._12_4_;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"CRITICAL: ");
  poVar3 = std::operator<<(poVar3,
                           "There is no valid way for Echo to obtain a token! Use one of the following ways:"
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,
                           "(1) Fill the BOT_TOKEN environment variable with the token (e.g. \'Bot 123456abcdef\')."
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,
                  "(2) Copy the example `token.eg.dat` as `token.dat` and write your own token to it.\n"
                 );
  exit(1);
}

Assistant:

int main() {
    dpp::log::filter = dpp::log::info;
    dpp::log::out = &std::cerr;

    std::cout << "Howdy, and thanks for trying out Discord++!\n"
              << "Feel free to drop into the official server at "
                 "https://discord.gg/4stCdkDHw6 if you have any questions.\n\n"
              << std::flush;

    std::cout << "Starting bot...\n\n";

    std::string token = getToken();
    if (token.empty()) {
        std::cerr << "CRITICAL: "
                  << "There is no valid way for Echo to obtain a token! Use "
                     "one of the following ways:"
                  << std::endl
                  << "(1) Fill the BOT_TOKEN environment variable with the "
                     "token (e.g. 'Bot 123456abcdef')."
                  << std::endl
                  << "(2) Copy the example `token.eg.dat` as `token.dat` and "
                     "write your own token to it.\n";
        exit(1);
    }

    // Create Bot object
    auto bot = std::make_shared<DppBot>();

    // Don't complain about unhandled events
    bot->debugUnhandled = true;

    // Declare the intent to receive guild messages
    // You don't need `NONE` it's just to show you how to declare multiple
    bot->intents = dpp::intents::NONE | dpp::intents::GUILD_MESSAGES;

    /*/
     * Create handler for the READY payload, this may be handled by the bot in
    the future.
     * The `self` object contains all information about the 'bot' user.
    /*/
    dpp::User self;
    bot->handlers.insert(
        {"READY", [&self](dpp::ReadyEvent ready) { self = *ready.user; }});

    bot->prefix = "~";

    bot->respond("help", "Mention me and I'll echo your message back!");

    bot->respond("about", [&bot](dpp::MessageCreateEvent msg) {
        std::ostringstream content;
        content << "Sure thing, "
                << *(msg.member->nick ? msg.author->username : msg.member->nick)
                << "!\n"
                << "I'm a simple bot meant to demonstrate the "
                   "Discord++ library.\n"
                << "You can learn more about Discord++ at "
                   "https://discord.gg/4stCdkDHw6";
        bot->createMessage()
            ->channel_id(*msg.channel_id)
            ->content(content.str())
            ->run();
    });

    bot->respond("lookatthis", [&bot](dpp::MessageCreateEvent msg) {
        std::ifstream ifs("image.jpg", std::ios::binary);
        if (!ifs) {
            std::cerr << "Couldn't load file 'image.jpg'!\n";
            return;
        }
        ifs.seekg(0, std::ios::end);
        std::ifstream::pos_type fileSize = ifs.tellg();
        ifs.seekg(0, std::ios::beg);
        auto file = std::make_shared<std::string>(fileSize, '\0');
        ifs.read(file->data(), fileSize);

        bot->createMessage()
            ->channel_id(*msg.channel_id)
            ->content("Look at this photograph")
            ->filename("image.jpg")
            ->filetype("image/jpg")
            ->file(file)
            ->run();
    });

    bot->respond("channelinfo", [&bot](dpp::MessageCreateEvent msg) {
        bot->getChannel()
            ->channel_id(*msg.channel_id)
            ->onRead([&bot, msg](bool error, json res) {
                bot->createMessage()
                    ->channel_id(*msg.channel_id)
                    ->content("```json\n" + res["body"].dump(4) + "\n```")
                    ->run();
            })
            ->run();
    });

    bot->respond("registerslash", [&bot, &self](dpp::MessageCreateEvent msg) {
        if (*msg.author->id == 106615803402547200) {
            bot->createGuildApplicationCommand()
                ->application_id(*self.id)
                ->guild_id(*msg.guild_id)
                ->name("echo")
                ->description("Echoes what you say")
                ->options({dpp::ApplicationCommandOption(
                    dpp::ApplicationCommandOptionType::STRING,
                    std::string("message"), dpp::omitted, std::string("The message to echo"),
                    dpp::omitted, true)})
                ->command_type(dpp::ApplicationCommandType::CHAT_INPUT)
                ->onRead([](bool error, json res) {
                    std::cout << res.dump(4) << std::endl;
                })
                ->run();
        }
    });

    bot->interactionHandlers.insert(
        {881674285683470376, [&bot](dpp::Interaction msg) {
             bot->createResponse()
                 ->interaction_id(*msg.id)
                 ->interaction_token(*msg.token)
                 ->interaction_type(
                     dpp::InteractionCallbackType::CHANNEL_MESSAGE_WITH_SOURCE)
                 ->data({{
                     "content",
                     *std::get<dpp::ApplicationCommandData>(*msg.data).options->at(0).value
                 }})
                 ->run();
         }});

    // Create handler for the MESSAGE_CREATE payload, this receives all messages
    // sent that the bot can see.
    bot->handlers.insert(
        {"MESSAGE_CREATE", [&bot, &self](const dpp::MessageCreateEvent msg) {
             // Ignore messages from other bots
             if (msg.webhook_id || (msg.author->bot && *msg.author->bot)) {
                 return;
             }

             // Scan through mentions in the message for self
             bool mentioned = false;
             for (const dpp::User &mention : *msg.mentions) {
                 mentioned = mentioned || (*mention.id == *self.id);
             }
             if (mentioned) {
                 // Identify and remove mentions of self from the message
                 std::string content = *msg.content;
                 unsigned int oldlength, length = content.length();
                 do {
                     oldlength = length;
                     content = std::regex_replace(
                         content,
                         std::regex(R"(<@!?)" + std::to_string(*self.id) +
                                    R"(> ?)"),
                         "");
                     length = content.length();
                 } while (oldlength > length);

                 // Get the target user's display name
                 std::string name = *(msg.member->nick ? msg.member->nick
                                                       : msg.author->username);

                 std::cout << "Echoing " << name << '\n';

                 // Echo the created message
                 bot->createMessage()
                     ->channel_id(*msg.channel_id)
                     ->content(content)
                     ->run();

                 // Set status to Playing "with [author]"
                 bot->send(3,
                           {{"game", {{"name", "with " + name}, {"type", 0}}},
                            {"status", "online"},
                            {"afk", false},
                            {"since", "null"}});
             }
         }});

    // Create Asio context, this handles async stuff.
    auto aioc = std::make_shared<asio::io_context>();

    // Set the bot up
    bot->initBot(9, token, aioc);

    // Run the bot!
    bot->run();

    return 0;
}